

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

DirPathPair * __thiscall
capnp::compiler::CompilerMain::interpretSourceFile
          (DirPathPair *__return_storage_ptr__,CompilerMain *this,StringPtr pathStr)

{
  OutputDirective *pOVar1;
  ProcessContext *pPVar2;
  long lVar3;
  PathPtr prefix;
  String *pSVar4;
  CompilerMain *pCVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar8;
  size_t extraout_RDX;
  void *__child_stack;
  undefined1 *puVar9;
  char *pcVar10;
  undefined1 auVar11 [8];
  void *in_R8;
  char *ptrCopy;
  long lVar12;
  OutputDirective *pOVar13;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  PathPtr cwd;
  Path local_e8;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  ArrayDisposer *local_b8;
  size_t local_b0;
  bool local_a8;
  String local_98;
  CompilerMain *local_80;
  DirPathPair *local_78;
  ArrayPtr<const_char> *local_70;
  size_t local_68;
  PathPtr local_60;
  ArrayPtr<const_char> *local_50;
  long local_48;
  ArrayPtr<const_char> local_40;
  
  iVar7 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
  local_60.parts.ptr = (String *)CONCAT44(extraout_var,iVar7);
  local_70 = (ArrayPtr<const_char> *)pathStr.content.ptr;
  local_68 = pathStr.content.size_;
  local_60.parts.size_ = extraout_RDX;
  kj::PathPtr::eval(&local_e8,&local_60,pathStr);
  local_c8 = (undefined1  [8])local_e8.parts.size_;
  uStack_c0 = (String *)((ulong)uStack_c0._4_4_ << 0x20);
  local_b8 = (ArrayDisposer *)0x20138f;
  local_b0 = 4;
  local_a8 = (String *)local_e8.parts.size_ != (String *)0x0;
  if ((String *)local_e8.parts.size_ == (String *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x7bb,FAILED,"path.size() > 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_c8);
    kj::_::Debug::Fault::fatal((Fault *)&local_98);
  }
  puVar9 = (undefined1 *)((long)&(((String *)(local_e8.parts.size_ + -0x18))->content).disposer + 7)
  ;
  local_80 = this;
  if (puVar9 == (undefined1 *)0x0) {
    uStack_c0 = (String *)0x1;
  }
  else {
    lVar12 = 1 - local_e8.parts.size_;
    lVar3 = local_e8.parts.size_ * 0x18;
    local_78 = __return_storage_ptr__;
    do {
      local_c8 = (undefined1  [8])local_e8.parts.ptr;
      local_98.content.ptr = (char *)((long)&local_e8.parts.ptr[-1].content.ptr + lVar3);
      sVar8 = (long)&((Array<char> *)local_e8.parts.size_)->ptr + lVar12;
      uStack_c0 = (String *)puVar9;
      local_98.content.size_ = sVar8;
      kj::
      Table<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>>
      ::find<0ul,kj::PathPtr&>
                ((Table<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>>
                  *)&local_50,(PathPtr *)&this->sourceDirectories);
      __return_storage_ptr__ = local_78;
      if ((local_50 != (ArrayPtr<const_char> *)0x0) && ((char)local_50[2].size_ == '\x01')) {
        local_78->dir = (ReadableDirectory *)local_50[2].ptr;
        kj::PathPtr::clone((PathPtr *)&local_78->path,(__fn *)&local_98,__child_stack,(int)sVar8,
                           in_R8);
        goto LAB_0011a53f;
      }
      puVar9 = puVar9 + -1;
      lVar12 = lVar12 + 1;
      uStack_c0 = (String *)local_e8.parts.size_;
      lVar3 = lVar3 + -0x18;
    } while (lVar12 != 0);
  }
  pCVar5 = local_80;
  prefix.parts.size_ = local_60.parts.size_;
  prefix.parts.ptr = local_60.parts.ptr;
  local_c8 = (undefined1  [8])local_e8.parts.ptr;
  bVar6 = kj::PathPtr::startsWith((PathPtr *)local_c8,prefix);
  if (bVar6) {
    iVar7 = (*((pCVar5->disk).ptr)->_vptr_Filesystem[1])();
    __return_storage_ptr__->dir = (ReadableDirectory *)CONCAT44(extraout_var_00,iVar7);
    local_c8 = (undefined1  [8])(local_e8.parts.ptr + local_60.parts.size_);
    uStack_c0 = (String *)(local_e8.parts.size_ - local_60.parts.size_);
    kj::PathPtr::clone((PathPtr *)&__return_storage_ptr__->path,(__fn *)local_c8,(void *)local_c8,
                       (int)uStack_c0,in_R8);
LAB_0011a53f:
    sVar8 = local_e8.parts.size_;
    pSVar4 = local_e8.parts.ptr;
    if (local_e8.parts.ptr != (String *)0x0) {
      local_e8.parts.ptr = (String *)0x0;
      local_e8.parts.size_ = 0;
      (**(local_e8.parts.disposer)->_vptr_ArrayDisposer)
                (local_e8.parts.disposer,pSVar4,0x18,sVar8,sVar8,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
    }
  }
  else {
    pOVar13 = (pCVar5->outputs).builder.ptr;
    pOVar1 = (pCVar5->outputs).builder.pos;
    if (pOVar13 != pOVar1) {
      do {
        pcVar10 = (pOVar13->name).ptr;
        sVar8 = (pOVar13->name).size_;
        kj::heapString((String *)local_c8,sVar8);
        if (sVar8 != 0) {
          auVar11 = (undefined1  [8])uStack_c0;
          if (uStack_c0 != (String *)0x0) {
            auVar11 = local_c8;
          }
          memcpy((void *)auVar11,pcVar10,sVar8);
        }
        pSVar4 = uStack_c0;
        auVar11 = local_c8;
        if (uStack_c0 != (String *)0x6) {
          if (uStack_c0 == (String *)0x2) {
            pcVar10 = "-";
            goto LAB_0011a4db;
          }
LAB_0011a578:
          pPVar2 = local_80->context;
          local_48 = local_68 - 1;
          local_50 = local_70;
          local_40.ptr = 
          ": File is not in the current directory and does not match any prefix defined with --src-prefix. Please pass an appropriate --src-prefix so I can figure out where to write the output for this file."
          ;
          local_40.size_ = 0xc4;
          kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                    (&local_98,(_ *)&local_50,&local_40,local_70);
          pcVar10 = local_98.content.ptr;
          if (local_98.content.size_ == 0) {
            pcVar10 = "";
          }
          (*pPVar2->_vptr_ProcessContext[2])
                    (pPVar2,pcVar10,local_98.content.size_ + (local_98.content.size_ == 0));
          sVar8 = local_98.content.size_;
          pcVar10 = local_98.content.ptr;
          if (local_98.content.ptr != (char *)0x0) {
            local_98.content.ptr = (char *)0x0;
            local_98.content.size_ = 0;
            (**(local_98.content.disposer)->_vptr_ArrayDisposer)
                      (local_98.content.disposer,pcVar10,1,sVar8,sVar8,0);
          }
          pSVar4 = uStack_c0;
          auVar11 = local_c8;
          if (local_c8 != (undefined1  [8])0x0) {
            local_c8 = (undefined1  [8])0x0;
            uStack_c0 = (String *)0x0;
            (**local_b8->_vptr_ArrayDisposer)(local_b8,auVar11,1,pSVar4,pSVar4,0);
          }
          break;
        }
        pcVar10 = "capnp";
LAB_0011a4db:
        iVar7 = bcmp((void *)local_c8,pcVar10,
                     (long)&(uStack_c0->content).ptr + (ulong)(uStack_c0 == (String *)0x0));
        if (iVar7 != 0) goto LAB_0011a578;
        if (auVar11 != (undefined1  [8])0x0) {
          local_c8 = (undefined1  [8])0x0;
          uStack_c0 = (String *)0x0;
          (**local_b8->_vptr_ArrayDisposer)(local_b8,auVar11,1,pSVar4,pSVar4);
        }
        pOVar13 = pOVar13 + 1;
      } while (pOVar13 != pOVar1);
    }
    iVar7 = (**((local_80->disk).ptr)->_vptr_Filesystem)();
    __return_storage_ptr__->dir = (ReadableDirectory *)CONCAT44(extraout_var_01,iVar7);
    (__return_storage_ptr__->path).parts.ptr = local_e8.parts.ptr;
    (__return_storage_ptr__->path).parts.size_ = local_e8.parts.size_;
    (__return_storage_ptr__->path).parts.disposer = local_e8.parts.disposer;
  }
  return __return_storage_ptr__;
}

Assistant:

DirPathPair interpretSourceFile(kj::StringPtr pathStr) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    KJ_REQUIRE(path.size() > 0);
    for (size_t i = path.size() - 1; i > 0; i--) {
      auto prefix = path.slice(0, i);
      auto remainder = path.slice(i, path.size());

      KJ_IF_SOME(sdir, sourceDirectories.find(prefix)) {
        if (sdir.isSourcePrefix) {
          return { *sdir.dir, remainder.clone() };
        }
      }
    }

    // No source prefix matched. Fall back to heuristic: try stripping the current directory,
    // otherwise don't strip anything.
    if (path.startsWith(cwd)) {
      return { disk->getCurrent(), path.slice(cwd.size(), path.size()).clone() };
    } else {
      // Hmm, no src-prefix matched and the file isn't even in the current directory. This might
      // be OK if we aren't generating any output anyway, but otherwise the results will almost
      // certainly not be what the user wanted. Let's print a warning, unless the output directives
      // are ones which we know do not produce output files. This is a hack.
      for (auto& output: outputs) {
        auto name = kj::str(output.name);
        if (name != "-" && name != "capnp") {
          context.warning(kj::str(pathStr,
              ": File is not in the current directory and does not match any prefix defined with "
              "--src-prefix. Please pass an appropriate --src-prefix so I can figure out where to "
              "write the output for this file."));
          break;
        }
      }

      return { disk->getRoot(), kj::mv(path) };
    }
  }